

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

iterator fmt::v5::
         vformat_to<mock_arg_formatter,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                   (range out,basic_string_view<char> format_str,
                   basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   args,locale_ref loc)

{
  output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_void> oVar1;
  basic_string_view<char> format_str_00;
  format_handler<mock_arg_formatter,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  h;
  undefined1 auStack_88 [8];
  internal *local_80;
  char *local_78;
  undefined4 local_70;
  output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_void> local_68;
  format_handler<mock_arg_formatter,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *local_60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_2
  local_58;
  void *local_50;
  arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  local_48;
  undefined4 local_38;
  undefined4 local_28;
  
  local_58 = args.field_1;
  local_60 = (format_handler<mock_arg_formatter,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)args.types_;
  local_78 = (char *)format_str.size_;
  local_80 = (internal *)format_str.data_;
  local_70 = 0;
  local_48.map_ = (entry *)0x0;
  local_48.size_ = 0;
  local_38 = 0;
  local_28 = 0;
  format_str_00.size_ = (size_t)auStack_88;
  format_str_00.data_ = local_78;
  local_68.it_.container =
       (back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>)
       (back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>)
       out.
       super_output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_void>.
       it_.container;
  local_50 = loc.locale_;
  internal::
  parse_format_string<false,char,fmt::v5::format_handler<mock_arg_formatter,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&>
            (local_80,format_str_00,local_60);
  oVar1.it_.container = local_68.it_.container;
  internal::
  arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  ::~arg_map(&local_48);
  return (iterator)(basic_buffer<char> *)oVar1.it_.container;
}

Assistant:

FMT_CONSTEXPR basic_format_specs() {}